

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

int __thiscall
Context::clone(Context *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __node_base *p_Var1;
  _Self local_80;
  shared_ptr<RuntimeSymbol> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  
  Context(this);
  local_80._M_cur = *(_Elt_pointer *)(__fn + 0x10);
  local_80._M_first = *(_Elt_pointer *)(__fn + 0x18);
  local_80._M_last = *(_Elt_pointer *)(__fn + 0x20);
  local_80._M_node = *(_Map_pointer *)(__fn + 0x28);
  while (local_80._M_cur != *(_Elt_pointer *)(__fn + 0x30)) {
    p_Var1 = &((local_80._M_cur)->_M_h)._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      std::__cxx11::string::string((string *)&name,(string *)(p_Var1 + 1));
      (*(code *)(p_Var1[5]._M_nxt)->_M_nxt[3]._M_nxt)(&local_60,p_Var1[5]._M_nxt,this);
      addSymbol(this,(string *)&name,&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__cxx11::string::~string((string *)&name);
    }
    std::operator+((_Self *)&name,&local_80,1);
    if (name._M_dataplus._M_p != *(pointer *)(__fn + 0x30)) {
      enterScope(this);
    }
    local_80._M_cur = local_80._M_cur + 1;
    if (local_80._M_cur == local_80._M_last) {
      local_80._M_cur = local_80._M_node[1];
      local_80._M_last = local_80._M_cur + 9;
      local_80._M_first = local_80._M_cur;
      local_80._M_node = local_80._M_node + 1;
    }
  }
  return (int)this;
}

Assistant:

Context Context::clone() const
{
  Context newContext{};
  for(auto scopesIt = scopes_.cbegin(); scopesIt != scopes_.cend(); ++scopesIt)
  {
    for(const auto& symbol : *scopesIt)
    {
      const auto name = symbol.first;
      newContext.addSymbol(name, symbol.second->clone(newContext));
    }

    if(scopesIt + 1 != scopes_.cend())
      newContext.enterScope();
  }
  return newContext;
}